

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitiveIntegers.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_primitiveInteger_unsigned_printString(sysbvm_context_t *context,uint64_t integer)

{
  sysbvm_tuple_t sVar1;
  size_t sVar2;
  size_t stringSize;
  bool bVar3;
  char buffer [64];
  byte local_48 [72];
  
  stringSize = 0;
  do {
    sVar2 = stringSize;
    stringSize = sVar2 + 1;
    local_48[sVar2] = (char)integer + (char)(integer / 10) * -10 | 0x30;
    bVar3 = 9 < integer;
    integer = integer / 10;
  } while (bVar3 || stringSize == 0);
  local_48[sVar2 + 1] = 0;
  sVar1 = sysbvm_string_createWithReversedString(context,stringSize,(char *)local_48);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_primitiveInteger_unsigned_printString(sysbvm_context_t *context, uint64_t integer)
{
    char buffer[64];
    size_t bufferSize = 0;

    // Extract each one of the digits.
    uint64_t value = integer;
    while (value != 0 || bufferSize == 0)
    {
        buffer[bufferSize++] = '0' + (value % 10);
        value /= 10;
    }

    buffer[bufferSize] = 0;
    return sysbvm_string_createWithReversedString(context, bufferSize, buffer);
}